

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPool.c
# Opt level: O1

void sbfPoolAtExit(void)

{
  sbfPoolCountImpl *psVar1;
  int iVar2;
  undefined4 uVar3;
  sbfPoolCountTree *psVar4;
  sbfPoolCountImpl *psVar5;
  sbfPoolCountTree sVar6;
  sbfPoolCountImpl *elm;
  sbfPoolCountImpl *psVar7;
  sbfPoolCountImpl *psVar8;
  sbfPoolCountImpl *psVar9;
  int iVar10;
  sbfPoolCountTree sVar11;
  anon_struct_32_4_548b78d9_for_mTreeEntry *paVar12;
  sbfPoolCountImpl *old;
  ulong uVar13;
  sbfPoolCountImpl *oleft;
  
  if (gSbfPoolAtExitListSize != 0) {
    uVar13 = 0;
    do {
      sbfPool_destroy(gSbfPoolAtExitList[uVar13]);
      uVar13 = uVar13 + 1;
    } while (uVar13 < gSbfPoolAtExitListSize);
  }
  free(gSbfPoolAtExitList);
  gSbfPoolAtExitListSize = 0;
  psVar4 = &gSbfPoolCountTree;
  psVar8 = (sbfPoolCountImpl *)0x0;
  do {
    elm = psVar8;
    psVar8 = ((anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar4)->rbe_left;
    psVar4 = (sbfPoolCountTree *)&psVar8->mTreeEntry;
  } while (psVar8 != (sbfPoolCountImpl *)0x0);
joined_r0x00107c4e:
  if (elm == (sbfPoolCountImpl *)0x0) {
    return;
  }
  psVar5 = sbfPoolCountTreeImpl_RB_NEXT(elm);
  psVar8 = (elm->mTreeEntry).rbe_left;
  psVar9 = (elm->mTreeEntry).rbe_right;
  sVar6.rbh_root = psVar9;
  if ((psVar8 == (sbfPoolCountImpl *)0x0) ||
     (sVar6.rbh_root = psVar8, psVar9 == (sbfPoolCountImpl *)0x0)) {
    psVar8 = (elm->mTreeEntry).rbe_parent;
    iVar10 = (elm->mTreeEntry).rbe_color;
    if (sVar6.rbh_root != (sbfPoolCountImpl *)0x0) {
      ((sVar6.rbh_root)->mTreeEntry).rbe_parent = psVar8;
    }
    if (psVar8 == (sbfPoolCountImpl *)0x0) {
      psVar8 = (sbfPoolCountImpl *)0x0;
      paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
    }
    else {
      paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar8->mTreeEntry).rbe_right;
      if ((psVar8->mTreeEntry).rbe_left == elm) {
        paVar12 = &psVar8->mTreeEntry;
      }
    }
    paVar12->rbe_left = sVar6.rbh_root;
  }
  else {
    do {
      psVar7 = psVar9;
      psVar9 = (psVar7->mTreeEntry).rbe_left;
    } while (psVar9 != (sbfPoolCountImpl *)0x0);
    sVar6.rbh_root = (psVar7->mTreeEntry).rbe_right;
    psVar8 = (psVar7->mTreeEntry).rbe_parent;
    iVar10 = (psVar7->mTreeEntry).rbe_color;
    if (sVar6.rbh_root != (sbfPoolCountImpl *)0x0) {
      ((sVar6.rbh_root)->mTreeEntry).rbe_parent = psVar8;
    }
    paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
    if (psVar8 != (sbfPoolCountImpl *)0x0) {
      paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar8->mTreeEntry).rbe_right;
      if ((psVar8->mTreeEntry).rbe_left == psVar7) {
        paVar12 = &psVar8->mTreeEntry;
      }
    }
    paVar12->rbe_left = sVar6.rbh_root;
    if ((psVar7->mTreeEntry).rbe_parent == elm) {
      psVar8 = psVar7;
    }
    psVar9 = (elm->mTreeEntry).rbe_left;
    psVar1 = (elm->mTreeEntry).rbe_right;
    iVar2 = (elm->mTreeEntry).rbe_color;
    uVar3 = *(undefined4 *)&(elm->mTreeEntry).field_0x1c;
    (psVar7->mTreeEntry).rbe_parent = (elm->mTreeEntry).rbe_parent;
    (psVar7->mTreeEntry).rbe_color = iVar2;
    *(undefined4 *)&(psVar7->mTreeEntry).field_0x1c = uVar3;
    (psVar7->mTreeEntry).rbe_left = psVar9;
    (psVar7->mTreeEntry).rbe_right = psVar1;
    psVar9 = (elm->mTreeEntry).rbe_parent;
    paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
    if (psVar9 != (sbfPoolCountImpl *)0x0) {
      paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar9->mTreeEntry).rbe_right;
      if ((psVar9->mTreeEntry).rbe_left == elm) {
        paVar12 = &psVar9->mTreeEntry;
      }
    }
    paVar12->rbe_left = psVar7;
    (((elm->mTreeEntry).rbe_left)->mTreeEntry).rbe_parent = psVar7;
    psVar9 = (elm->mTreeEntry).rbe_right;
    psVar1 = psVar8;
    if (psVar9 != (sbfPoolCountImpl *)0x0) {
      (psVar9->mTreeEntry).rbe_parent = psVar7;
    }
    for (; psVar1 != (sbfPoolCountImpl *)0x0; psVar1 = (psVar1->mTreeEntry).rbe_parent) {
    }
  }
  sVar11.rbh_root = gSbfPoolCountTree.rbh_root;
  if (iVar10 == 0) {
    do {
      if (((sVar6.rbh_root != (sbfPoolCountImpl *)0x0) &&
          (((sVar6.rbh_root)->mTreeEntry).rbe_color != 0)) || (sVar6.rbh_root == sVar11.rbh_root))
      goto LAB_0010804f;
      psVar9 = (psVar8->mTreeEntry).rbe_left;
      if (psVar9 == sVar6.rbh_root) {
        psVar9 = (psVar8->mTreeEntry).rbe_right;
        if ((psVar9->mTreeEntry).rbe_color == 1) {
          (psVar9->mTreeEntry).rbe_color = 0;
          (psVar8->mTreeEntry).rbe_color = 1;
          psVar7 = (psVar9->mTreeEntry).rbe_left;
          (psVar8->mTreeEntry).rbe_right = psVar7;
          if (psVar7 != (sbfPoolCountImpl *)0x0) {
            (psVar7->mTreeEntry).rbe_parent = psVar8;
          }
          psVar7 = (psVar8->mTreeEntry).rbe_parent;
          (psVar9->mTreeEntry).rbe_parent = psVar7;
          paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
          psVar1 = psVar9;
          if (psVar7 != (sbfPoolCountImpl *)0x0) {
            psVar7 = (psVar8->mTreeEntry).rbe_parent;
            paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar7->mTreeEntry).rbe_right;
            psVar1 = sVar11.rbh_root;
            if (psVar8 == (psVar7->mTreeEntry).rbe_left) {
              paVar12 = &psVar7->mTreeEntry;
            }
          }
          sVar11.rbh_root = psVar1;
          paVar12->rbe_left = psVar9;
          (psVar9->mTreeEntry).rbe_left = psVar8;
          (psVar8->mTreeEntry).rbe_parent = psVar9;
          psVar9 = (psVar8->mTreeEntry).rbe_right;
        }
        psVar7 = (psVar9->mTreeEntry).rbe_left;
        if (((psVar7 != (sbfPoolCountImpl *)0x0) && ((psVar7->mTreeEntry).rbe_color != 0)) ||
           ((psVar1 = (psVar9->mTreeEntry).rbe_right, psVar1 != (sbfPoolCountImpl *)0x0 &&
            ((psVar1->mTreeEntry).rbe_color != 0)))) {
          psVar1 = (psVar9->mTreeEntry).rbe_right;
          if ((psVar1 == (sbfPoolCountImpl *)0x0) || ((psVar1->mTreeEntry).rbe_color == 0)) {
            if (psVar7 != (sbfPoolCountImpl *)0x0) {
              (psVar7->mTreeEntry).rbe_color = 0;
            }
            (psVar9->mTreeEntry).rbe_color = 1;
            psVar1 = (psVar7->mTreeEntry).rbe_right;
            (psVar9->mTreeEntry).rbe_left = psVar1;
            if (psVar1 != (sbfPoolCountImpl *)0x0) {
              (psVar1->mTreeEntry).rbe_parent = psVar9;
            }
            psVar1 = (psVar9->mTreeEntry).rbe_parent;
            (psVar7->mTreeEntry).rbe_parent = psVar1;
            paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
            if (psVar1 != (sbfPoolCountImpl *)0x0) {
              psVar1 = (psVar9->mTreeEntry).rbe_parent;
              paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar1->mTreeEntry).rbe_right;
              if (psVar9 == (psVar1->mTreeEntry).rbe_left) {
                paVar12 = &psVar1->mTreeEntry;
              }
            }
            paVar12->rbe_left = psVar7;
            (psVar7->mTreeEntry).rbe_right = psVar9;
            (psVar9->mTreeEntry).rbe_parent = psVar7;
            psVar9 = (psVar8->mTreeEntry).rbe_right;
          }
          (psVar9->mTreeEntry).rbe_color = (psVar8->mTreeEntry).rbe_color;
          (psVar8->mTreeEntry).rbe_color = 0;
          psVar9 = (psVar9->mTreeEntry).rbe_right;
          if (psVar9 != (sbfPoolCountImpl *)0x0) {
            (psVar9->mTreeEntry).rbe_color = 0;
          }
          psVar9 = (psVar8->mTreeEntry).rbe_right;
          psVar7 = (psVar9->mTreeEntry).rbe_left;
          (psVar8->mTreeEntry).rbe_right = psVar7;
          if (psVar7 != (sbfPoolCountImpl *)0x0) {
            (psVar7->mTreeEntry).rbe_parent = psVar8;
          }
          psVar7 = (psVar8->mTreeEntry).rbe_parent;
          (psVar9->mTreeEntry).rbe_parent = psVar7;
          paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
          if (psVar7 != (sbfPoolCountImpl *)0x0) {
            psVar7 = (psVar8->mTreeEntry).rbe_parent;
            paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar7->mTreeEntry).rbe_right;
            if (psVar8 == (psVar7->mTreeEntry).rbe_left) {
              paVar12 = &psVar7->mTreeEntry;
            }
          }
          paVar12->rbe_left = psVar9;
          (psVar9->mTreeEntry).rbe_left = psVar8;
          goto LAB_00108044;
        }
      }
      else {
        if ((psVar9->mTreeEntry).rbe_color == 1) {
          (psVar9->mTreeEntry).rbe_color = 0;
          (psVar8->mTreeEntry).rbe_color = 1;
          psVar7 = (psVar9->mTreeEntry).rbe_right;
          (psVar8->mTreeEntry).rbe_left = psVar7;
          if (psVar7 != (sbfPoolCountImpl *)0x0) {
            (psVar7->mTreeEntry).rbe_parent = psVar8;
          }
          psVar7 = (psVar8->mTreeEntry).rbe_parent;
          (psVar9->mTreeEntry).rbe_parent = psVar7;
          paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
          psVar1 = psVar9;
          if (psVar7 != (sbfPoolCountImpl *)0x0) {
            psVar7 = (psVar8->mTreeEntry).rbe_parent;
            paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar7->mTreeEntry).rbe_right;
            psVar1 = sVar11.rbh_root;
            if (psVar8 == (psVar7->mTreeEntry).rbe_left) {
              paVar12 = &psVar7->mTreeEntry;
            }
          }
          sVar11.rbh_root = psVar1;
          paVar12->rbe_left = psVar9;
          (psVar9->mTreeEntry).rbe_right = psVar8;
          (psVar8->mTreeEntry).rbe_parent = psVar9;
          psVar9 = (psVar8->mTreeEntry).rbe_left;
        }
        psVar7 = (psVar9->mTreeEntry).rbe_left;
        if (((psVar7 != (sbfPoolCountImpl *)0x0) && ((psVar7->mTreeEntry).rbe_color != 0)) ||
           ((psVar1 = (psVar9->mTreeEntry).rbe_right, psVar1 != (sbfPoolCountImpl *)0x0 &&
            ((psVar1->mTreeEntry).rbe_color != 0)))) goto LAB_00107eb9;
      }
      (psVar9->mTreeEntry).rbe_color = 1;
      sVar6.rbh_root = psVar8;
      psVar8 = (psVar8->mTreeEntry).rbe_parent;
    } while( true );
  }
  goto LAB_0010805b;
LAB_00107eb9:
  if ((psVar7 == (sbfPoolCountImpl *)0x0) || ((psVar7->mTreeEntry).rbe_color == 0)) {
    psVar7 = (psVar9->mTreeEntry).rbe_right;
    if (psVar7 != (sbfPoolCountImpl *)0x0) {
      (psVar7->mTreeEntry).rbe_color = 0;
    }
    (psVar9->mTreeEntry).rbe_color = 1;
    psVar1 = (psVar7->mTreeEntry).rbe_left;
    (psVar9->mTreeEntry).rbe_right = psVar1;
    if (psVar1 != (sbfPoolCountImpl *)0x0) {
      (psVar1->mTreeEntry).rbe_parent = psVar9;
    }
    psVar1 = (psVar9->mTreeEntry).rbe_parent;
    (psVar7->mTreeEntry).rbe_parent = psVar1;
    paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
    if (psVar1 != (sbfPoolCountImpl *)0x0) {
      psVar1 = (psVar9->mTreeEntry).rbe_parent;
      paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar1->mTreeEntry).rbe_right;
      if (psVar9 == (psVar1->mTreeEntry).rbe_left) {
        paVar12 = &psVar1->mTreeEntry;
      }
    }
    paVar12->rbe_left = psVar7;
    (psVar7->mTreeEntry).rbe_left = psVar9;
    (psVar9->mTreeEntry).rbe_parent = psVar7;
    psVar9 = (psVar8->mTreeEntry).rbe_left;
  }
  (psVar9->mTreeEntry).rbe_color = (psVar8->mTreeEntry).rbe_color;
  (psVar8->mTreeEntry).rbe_color = 0;
  psVar9 = (psVar9->mTreeEntry).rbe_left;
  if (psVar9 != (sbfPoolCountImpl *)0x0) {
    (psVar9->mTreeEntry).rbe_color = 0;
  }
  psVar9 = (psVar8->mTreeEntry).rbe_left;
  psVar7 = (psVar9->mTreeEntry).rbe_right;
  (psVar8->mTreeEntry).rbe_left = psVar7;
  if (psVar7 != (sbfPoolCountImpl *)0x0) {
    (psVar7->mTreeEntry).rbe_parent = psVar8;
  }
  psVar7 = (psVar8->mTreeEntry).rbe_parent;
  (psVar9->mTreeEntry).rbe_parent = psVar7;
  paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&gSbfPoolCountTree;
  if (psVar7 != (sbfPoolCountImpl *)0x0) {
    psVar7 = (psVar8->mTreeEntry).rbe_parent;
    paVar12 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar7->mTreeEntry).rbe_right;
    if (psVar8 == (psVar7->mTreeEntry).rbe_left) {
      paVar12 = &psVar7->mTreeEntry;
    }
  }
  paVar12->rbe_left = psVar9;
  (psVar9->mTreeEntry).rbe_right = psVar8;
LAB_00108044:
  (psVar8->mTreeEntry).rbe_parent = psVar9;
  sVar6 = gSbfPoolCountTree;
LAB_0010804f:
  if (sVar6.rbh_root != (sbfPoolCountImpl *)0x0) {
    ((sVar6.rbh_root)->mTreeEntry).rbe_color = 0;
  }
LAB_0010805b:
  free(elm);
  elm = psVar5;
  goto joined_r0x00107c4e;
}

Assistant:

static void
sbfPoolAtExit (void)
{
    u_int        i;
    sbfPoolCount count;
    sbfPoolCount count1;

    for (i = 0; i < gSbfPoolAtExitListSize; i++)
        sbfPool_destroy (gSbfPoolAtExitList[i]);
    free (gSbfPoolAtExitList);
    gSbfPoolAtExitListSize = 0;

    RB_FOREACH_SAFE (count, sbfPoolCountTreeImpl, &gSbfPoolCountTree, count1)
    {
        RB_REMOVE (sbfPoolCountTreeImpl, &gSbfPoolCountTree, count);
        free (count);
    }
}